

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O1

bool __thiscall
cmWorkerPool::JobT::RunProcess
          (JobT *this,ProcessResultT *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command,string *workingDirectory)

{
  cmWorkerPoolInternal *pcVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  
  pcVar1 = (this->Pool_->Int_)._M_t.
           super___uniq_ptr_impl<cmWorkerPoolInternal,_std::default_delete<cmWorkerPoolInternal>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmWorkerPoolInternal_*,_std::default_delete<cmWorkerPoolInternal>_>
           .super__Head_base<0UL,_cmWorkerPoolInternal_*,_false>._M_head_impl;
  uVar4 = (ulong)this->WorkerIndex_;
  lVar2 = *(long *)&(pcVar1->Workers).
                    super__Vector_base<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>,_std::allocator<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>_>_>
                    ._M_impl;
  uVar5 = (long)*(pointer *)
                 ((long)&(pcVar1->Workers).
                         super__Vector_base<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>,_std::allocator<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>_>_>
                 + 8) - lVar2 >> 3;
  if (uVar4 < uVar5) {
    bVar3 = cmWorkerPoolWorker::RunProcess
                      (*(cmWorkerPoolWorker **)(lVar2 + uVar4 * 8),result,command,workingDirectory);
    return bVar3;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4,uVar5
            );
}

Assistant:

bool cmWorkerPool::JobT::RunProcess(ProcessResultT& result,
                                    std::vector<std::string> const& command,
                                    std::string const& workingDirectory)
{
  // Get worker by index
  auto* wrk = Pool_->Int_->Workers.at(WorkerIndex_).get();
  return wrk->RunProcess(result, command, workingDirectory);
}